

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::mouseReleaseEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  QAction *action;
  long lVar4;
  undefined4 in_ECX;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) == 0) {
    bVar1 = QMenuPrivate::mouseEventTaken(this_00,e);
    if ((!bVar1) &&
       (bVar1 = QMenuPrivate::mouseDown == this, QMenuPrivate::mouseDown = (QMenu *)0x0, bVar1)) {
      QMenuPrivate::setSyncAction(this_00);
      auVar10 = QEventPoint::globalPosition();
      auVar9._0_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._8_8_;
      auVar9._8_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._0_8_;
      auVar9 = minpd(_DAT_0066f5d0,auVar9);
      auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
      auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
      uVar5 = movmskpd(in_ECX,auVar10);
      uVar6 = (ulong)(uint)(int)auVar9._8_8_;
      uVar3 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
      if ((uVar5 & 1) == 0) {
        uVar3 = 0x8000000000000000;
      }
      if ((uVar5 & 2) == 0) {
        uVar6 = 0x80000000;
      }
      local_30 = (QPoint)(uVar6 | uVar3);
      bVar1 = QMenuPrivate::hasMouseMoved(this_00,&local_30);
      if (bVar1) {
        auVar9 = QEventPoint::position();
        auVar7._0_8_ = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar9._8_8_;
        auVar7._8_8_ = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar9._0_8_;
        auVar9 = minpd(_DAT_0066f5d0,auVar7);
        auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
        auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
        uVar5 = movmskpd(uVar5,auVar8);
        uVar3 = 0x8000000000000000;
        if ((uVar5 & 1) != 0) {
          uVar3 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
        }
        uVar6 = 0x80000000;
        if ((uVar5 & 2) != 0) {
          uVar6 = (ulong)(uint)(int)auVar9._8_8_;
        }
        action = QMenuPrivate::actionAt(this_00,(QPoint)(uVar6 | uVar3));
        if (action != (QAction *)0x0) {
          if (action == this_00->currentAction) {
            QAction::menuObject();
            lVar4 = QMetaObject::cast((QObject *)&staticMetaObject);
            if (lVar4 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
                QMenuPrivate::activateAction(this_00,action,Trigger,true);
                return;
              }
              goto LAB_0046536c;
            }
          }
          else {
            cVar2 = QAction::isEnabled();
            if (cVar2 != '\0') goto LAB_004652fc;
          }
          goto LAB_004651ba;
        }
      }
LAB_004652fc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QMenuPrivate::hideUpToMenuBar(this_00);
        return;
      }
      goto LAB_0046536c;
    }
  }
LAB_004651ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0046536c:
  __stack_chk_fail();
}

Assistant:

void QMenu::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    if (QMenuPrivate::mouseDown != this) {
        QMenuPrivate::mouseDown = nullptr;
        return;
    }

    QMenuPrivate::mouseDown = nullptr;
    d->setSyncAction();

    if (!d->hasMouseMoved(e->globalPosition().toPoint())) {
        // We don't want to trigger a menu item if the mouse hasn't moved
        // since the popup was opened. Instead we want to close the menu.
        d->hideUpToMenuBar();
        return;
    }

    QAction *action = d->actionAt(e->position().toPoint());
    if (action && action == d->currentAction) {
        if (!action->menu()) {
#if defined(Q_OS_WIN)
            //On Windows only context menus can be activated with the right button
            if (e->button() == Qt::LeftButton || d->topCausedWidget() == 0)
#endif
                d->activateAction(action, QAction::Trigger);
        }
    } else if (!action || action->isEnabled()) {
        d->hideUpToMenuBar();
    }
}